

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void radau_set(int order,double *xtab,double *weight)

{
  ostream *poVar1;
  
  switch(order) {
  case 1:
    *xtab = -1.0;
    *weight = 2.0;
    break;
  case 2:
    *xtab = -1.0;
    xtab[1] = 0.3333333333333333;
    *weight = 0.5;
    weight[1] = 1.5;
    break;
  case 3:
    *xtab = -1.0;
    xtab[1] = -0.28989794855663564;
    xtab[2] = 0.6898979485566357;
    *weight = 0.2222222222222222;
    weight[1] = 1.0249716523768433;
    weight[2] = 0.7528061254009345;
    break;
  case 4:
    *xtab = -1.0;
    xtab[1] = -0.5753189235216941;
    xtab[2] = 0.18106627111853058;
    xtab[3] = 0.8228240809745921;
    *weight = 0.125;
    weight[1] = 0.6576886399601195;
    weight[2] = 0.7763869376863438;
    weight[3] = 0.44092442235353674;
    break;
  case 5:
    *xtab = -1.0;
    xtab[1] = -0.7204802713124389;
    xtab[2] = -0.16718086473783364;
    xtab[3] = 0.44631397272375234;
    xtab[4] = 0.8857916077709647;
    *weight = 0.08;
    weight[1] = 0.4462078021671415;
    weight[2] = 0.6236530459514825;
    weight[3] = 0.5627120302989241;
    weight[4] = 0.28742712158245187;
    break;
  case 6:
    *xtab = -1.0;
    xtab[1] = -0.8029298284023472;
    xtab[2] = -0.3909285467072722;
    xtab[3] = 0.12405037950522771;
    xtab[4] = 0.6039731642527837;
    xtab[5] = 0.9203802858970626;
    *weight = 0.05555555555555555;
    weight[1] = 0.31964075322051094;
    weight[2] = 0.48538718846896994;
    weight[3] = 0.520926783189575;
    weight[4] = 0.41690133431190773;
    weight[5] = 0.20158838525348083;
    break;
  case 7:
    *xtab = -1.0;
    xtab[1] = -0.8538913426394822;
    xtab[2] = -0.538467724060109;
    xtab[3] = -0.11734303754310027;
    xtab[4] = 0.3260306194376914;
    xtab[5] = 0.7038428006630314;
    xtab[6] = 0.9413671456804302;
    *weight = 0.04081632653061224;
    weight[1] = 0.2392274892253124;
    weight[2] = 0.38094987364423116;
    weight[3] = 0.4471098290145665;
    weight[4] = 0.42470377900595563;
    weight[5] = 0.3182042314673015;
    weight[6] = 0.14898847111202063;
    break;
  case 8:
    *xtab = -1.0;
    xtab[1] = -0.8874748789261557;
    xtab[2] = -0.6395186165262152;
    xtab[3] = -0.2947505657736607;
    xtab[4] = 0.09430725266111077;
    xtab[5] = 0.4684203544308211;
    xtab[6] = 0.7706418936781916;
    xtab[7] = 0.955041227122575;
    *weight = 0.03125;
    weight[1] = 0.1853581548029793;
    weight[2] = 0.30413062064678514;
    weight[3] = 0.3765175453891186;
    weight[4] = 0.39157216745249357;
    weight[5] = 0.34701479563450127;
    weight[6] = 0.24964790132986497;
    weight[7] = 0.1145088147442572;
    break;
  case 9:
    *xtab = -1.0;
    xtab[1] = -0.9107320894200603;
    xtab[2] = -0.7112674859157089;
    xtab[3] = -0.426350485711139;
    xtab[4] = -0.0903733696068533;
    xtab[5] = 0.2561356708334554;
    xtab[6] = 0.5713830412087385;
    xtab[7] = 0.8173527842004121;
    xtab[8] = 0.9644401697052731;
    *weight = 0.024691358024691357;
    weight[1] = 0.1476540190463154;
    weight[2] = 0.24718937820459305;
    weight[3] = 0.316843775670438;
    weight[4] = 0.3482730027729666;
    weight[5] = 0.33769396697592957;
    weight[6] = 0.2863866963572312;
    weight[7] = 0.20055329802455196;
    weight[8] = 0.09071450492328292;
    break;
  case 10:
    *xtab = -1.0;
    xtab[1] = -0.9274843742335811;
    xtab[2] = -0.7638420424200026;
    xtab[3] = -0.5256460303700792;
    xtab[4] = -0.23623446939058804;
    xtab[5] = 0.07605919783797813;
    xtab[6] = 0.38066484014472435;
    xtab[7] = 0.6477666876740095;
    xtab[8] = 0.8512252205816079;
    xtab[9] = 0.971175180702247;
    *weight = 0.02;
    weight[1] = 0.12029667055748162;
    weight[2] = 0.20427013187900067;
    weight[3] = 0.2681948378411787;
    weight[4] = 0.3058592877244226;
    weight[5] = 0.3135824572269384;
    weight[6] = 0.2906101648329183;
    weight[7] = 0.2391934317143797;
    weight[8] = 0.16437601273692148;
    weight[9] = 0.0736170054867585;
    break;
  case 0xb:
    *xtab = -1.0;
    xtab[1] = -0.939941935677027;
    xtab[2] = -0.8034219755802935;
    xtab[3] = -0.6019578420737977;
    xtab[4] = -0.3518889233533302;
    xtab[5] = -0.07347753143132127;
    xtab[6] = 0.2107203062284263;
    xtab[7] = 0.4776806479830875;
    xtab[8] = 0.7057771007138596;
    xtab[9] = 0.8765358562457037;
    xtab[10] = 0.9761647731351688;
    *weight = 0.01652892561983471;
    weight[1] = 0.09984608190796807;
    weight[2] = 0.17131761920665983;
    weight[3] = 0.22886612384897662;
    weight[4] = 0.2678670861896842;
    weight[5] = 0.28516556394100734;
    weight[6] = 0.27936133310338307;
    weight[7] = 0.2509253776971284;
    weight[8] = 0.20216310854002442;
    weight[9] = 0.13703368213320224;
    weight[10] = 0.06092509781213114;
    break;
  case 0xc:
    *xtab = -1.0;
    xtab[1] = -0.9494527592049593;
    xtab[2] = -0.8339167731051897;
    xtab[3] = -0.6616497992456372;
    xtab[4] = -0.4444065697819359;
    xtab[5] = -0.19699455953427836;
    xtab[6] = 0.06372477382083191;
    xtab[7] = 0.31998368417066964;
    xtab[8] = 0.5543187859123243;
    xtab[9] = 0.7507615497111139;
    xtab[10] = 0.8959290977456389;
    xtab[0xb] = 0.9799634390766392;
    *weight = 0.013888888888888888;
    weight[1] = 0.08417213493868098;
    weight[2] = 0.14556366885399513;
    weight[3] = 0.19699853482608964;
    weight[4] = 0.23500311514498584;
    weight[5] = 0.25699133815270775;
    weight[6] = 0.2614656605521331;
    weight[7] = 0.24812156080400996;
    weight[8] = 0.21786887902619245;
    weight[9] = 0.17277063931330858;
    weight[10] = 0.11590748029173839;
    weight[0xb] = 0.0512480992072693;
    break;
  case 0xd:
    *xtab = -1.0;
    xtab[1] = -0.9568758736682993;
    xtab[2] = -0.857884202528822;
    xtab[3] = -0.7091050875298718;
    xtab[4] = -0.5191977790504541;
    xtab[5] = -0.29920130055451;
    xtab[6] = -0.06190169862563534;
    xtab[7] = 0.17890983759708465;
    xtab[8] = 0.40923823147483956;
    xtab[9] = 0.6156978909402919;
    xtab[10] = 0.7862910182330467;
    xtab[0xb] = 0.9111070736891845;
    xtab[0xc] = 0.9829218900231451;
    *weight = 0.011834319526627219;
    weight[1] = 0.07190241629249552;
    weight[2] = 0.12510383433115235;
    weight[3] = 0.17100346047061665;
    weight[4] = 0.20696061145587707;
    weight[5] = 0.23088886288699542;
    weight[6] = 0.24139834228769114;
    weight[7] = 0.23787854766071204;
    weight[8] = 0.22053422928845146;
    weight[9] = 0.19037371555963173;
    weight[10] = 0.1491509500900002;
    weight[0xb] = 0.09926780688184708;
    weight[0xc] = 0.04370290326790208;
    break;
  case 0xe:
    *xtab = -1.0;
    xtab[1] = -0.9627792699780243;
    xtab[2] = -0.877048918201462;
    xtab[3] = -0.7473896426133788;
    xtab[4] = -0.580314056546875;
    xtab[5] = -0.3842020034392033;
    xtab[6] = -0.1688879280426809;
    xtab[7] = 0.05483122799176455;
    xtab[8] = 0.2757372054355224;
    xtab[9] = 0.48275291858847497;
    xtab[10] = 0.6654979772168845;
    xtab[0xb] = 0.8148095506019948;
    xtab[0xc] = 0.9232037225206433;
    xtab[0xd] = 0.9852706979478214;
    *weight = 0.01020408163265306;
    weight[1] = 0.06212201690777146;
    weight[2] = 0.10860772274436283;
    weight[3] = 0.14962053935312136;
    weight[4] = 0.18312700212572966;
    weight[5] = 0.20744976333517567;
    weight[6] = 0.22136981149957094;
    weight[7] = 0.2241893480027078;
    weight[8] = 0.21576710060461884;
    weight[9] = 0.19652551845298244;
    weight[10] = 0.1674297278910863;
    weight[0xb] = 0.12993966873734233;
    weight[0xc] = 0.0859405354429804;
    weight[0xd] = 0.03770716326989691;
    break;
  case 0xf:
    *xtab = -1.0;
    xtab[1] = -0.9675504681972005;
    xtab[2] = -0.8926054001205508;
    xtab[3] = -0.7786856176390311;
    xtab[4] = -0.6307794788869493;
    xtab[5] = -0.4553529057785294;
    xtab[6] = -0.26007337674080794;
    xtab[7] = -0.05347572267974606;
    xtab[8] = 0.15541068538485947;
    xtab[9] = 0.35745651202212764;
    xtab[10] = 0.543831458701484;
    xtab[0xb] = 0.7063902646375725;
    xtab[0xc] = 0.8380290006360896;
    xtab[0xd] = 0.9329971909359738;
    xtab[0xe] = 0.9871664784143631;
    *weight = 0.008888888888888889;
    weight[1] = 0.0542027800486445;
    weight[2] = 0.0951295994604809;
    weight[3] = 0.13187546250495163;
    weight[4] = 0.16285447730383262;
    weight[5] = 0.1867151458394509;
    weight[6] = 0.20241518703061842;
    weight[7] = 0.20926860814769457;
    weight[8] = 0.20697596024955375;
    weight[9] = 0.19563750304511612;
    weight[10] = 0.17574887264244768;
    weight[0xb] = 0.14817952700346726;
    weight[0xc] = 0.11413520348975276;
    weight[0xd] = 0.07510839276050645;
    weight[0xe] = 0.03286439158459353;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"RADAU_SET - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of ORDER = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,order);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  Legal values are 1 to 15.\n");
    exit(1);
  }
  return;
}

Assistant:

void radau_set ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    RADAU_SET sets abscissas and weights for Radau quadrature.
//
//  Discussion:
//
//    The Radau rule is distinguished by the fact that the left endpoint
//    (-1) is always an abscissa.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT[I] * F ( XTAB[I] )
//
//    The quadrature rule will integrate exactly all polynomials up to
//    X^(2*ORDER-2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    01 May 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//    ORDER must be between 1 and 15.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  if ( order == 1 )
  {
    xtab[0] =   - 1.0E+00;
    weight[0] =   2.0E+00;
  }
  else if ( order == 2 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =    1.0E+00 / 3.0E+00;

    weight[0] =  0.5E+00;
    weight[1] =  1.5E+00;
  }
  else if ( order == 3 )
  {
    xtab[0] =   - 1.0E+00;
    xtab[1] =   - 0.289897948556635619639456814941E+00;
    xtab[2] =     0.689897948556635619639456814941E+00;

    weight[0] =  0.222222222222222222222222222222E+00;
    weight[1] =  0.102497165237684322767762689304E+01;
    weight[2] =  0.752806125400934550100150884739E+00;
  }
  else if ( order == 4 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.575318923521694112050483779752E+00;
    xtab[2] =    0.181066271118530578270147495862E+00;
    xtab[3] =    0.822824080974592105208907712461E+00;

    weight[0] =  0.125E+00;
    weight[1] =  0.657688639960119487888578442146E+00;
    weight[2] =  0.776386937686343761560464613780E+00;
    weight[3] =  0.440924422353536750550956944074E+00;
  }
  else if ( order == 5 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.720480271312438895695825837750E+00;
    xtab[2] =  - 0.167180864737833640113395337326E+00;
    xtab[3] =    0.446313972723752344639908004629E+00;
    xtab[4] =    0.885791607770964635613757614892E+00;

    weight[0] =  0.08E+00;
    weight[1] =  0.446207802167141488805120436457E+00;
    weight[2] =  0.623653045951482508163709823153E+00;
    weight[3] =  0.562712030298924120384345300681E+00;
    weight[4] =  0.287427121582451882646824439708E+00;
  }
  else if ( order == 6 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.802929828402347147753002204224E+00;
    xtab[2] =  - 0.390928546707272189029229647442E+00;
    xtab[3] =    0.124050379505227711989974959990E+00;
    xtab[4] =    0.603973164252783654928415726409E+00;
    xtab[5] =    0.920380285897062515318386619813E+00;

    weight[0] =  0.555555555555555555555555555556E-01;
    weight[1] =  0.319640753220510966545779983796E+00;
    weight[2] =  0.485387188468969916159827915587E+00;
    weight[3] =  0.520926783189574982570229406570E+00;
    weight[4] =  0.416901334311907738959406382743E+00;
    weight[5] =  0.201588385253480840209200755749E+00;
  }
  else if ( order == 7 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.853891342639482229703747931639E+00;
    xtab[2] =  - 0.538467724060109001833766720231E+00;
    xtab[3] =  - 0.117343037543100264162786683611E+00;
    xtab[4] =    0.326030619437691401805894055838E+00;
    xtab[5] =    0.703842800663031416300046295008E+00;
    xtab[6] =    0.941367145680430216055899446174E+00;

    weight[0] =  0.408163265306122448979591836735E-01;
    weight[1] =  0.239227489225312405787077480770E+00;
    weight[2] =  0.380949873644231153805938347876E+00;
    weight[3] =  0.447109829014566469499348953642E+00;
    weight[4] =  0.424703779005955608398308039150E+00;
    weight[5] =  0.318204231467301481744870434470E+00;
    weight[6] =  0.148988471112020635866497560418E+00;
  }
  else if ( order == 8 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.887474878926155707068695617935E+00;
    xtab[2] =  - 0.639518616526215270024840114382E+00;
    xtab[3] =  - 0.294750565773660725252184459658E+00;
    xtab[4] =    0.943072526611107660028971153047E-01;
    xtab[5] =    0.468420354430821063046421216613E+00;
    xtab[6] =    0.770641893678191536180719525865E+00;
    xtab[7] =    0.955041227122575003782349000858E+00;

    weight[0] =  0.03125E+00;
    weight[1] =  0.185358154802979278540728972699E+00;
    weight[2] =  0.304130620646785128975743291400E+00;
    weight[3] =  0.376517545389118556572129261442E+00;
    weight[4] =  0.391572167452493593082499534004E+00;
    weight[5] =  0.347014795634501280228675918422E+00;
    weight[6] =  0.249647901329864963257869293513E+00;
    weight[7] =  0.114508814744257199342353728520E+00;
  }
  else if ( order == 9 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.910732089420060298533757956283E+00;
    xtab[2] =  - 0.711267485915708857029562959544E+00;
    xtab[3] =  - 0.426350485711138962102627520502E+00;
    xtab[4] =  - 0.903733696068532980645444599064E-01;
    xtab[5] =    0.256135670833455395138292079035E+00;
    xtab[6] =    0.571383041208738483284917464837E+00;
    xtab[7] =    0.817352784200412087992517083851E+00;
    xtab[8] =    0.964440169705273096373589797925E+00;

    weight[0] =  0.246913580246913580246913580247E-01;
    weight[1] =  0.147654019046315385819588499802E+00;
    weight[2] =  0.247189378204593052361239794969E+00;
    weight[3] =  0.316843775670437978338000849642E+00;
    weight[4] =  0.348273002772966594071991031186E+00;
    weight[5] =  0.337693966975929585803724239792E+00;
    weight[6] =  0.286386696357231171146705637752E+00;
    weight[7] =  0.200553298024551957421165090417E+00;
    weight[8] =  0.907145049232829170128934984159E-01;
  }
  else if ( order == 10 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.927484374233581078117671398464E+00;
    xtab[2] =  - 0.763842042420002599615429776011E+00;
    xtab[3] =  - 0.525646030370079229365386614293E+00;
    xtab[4] =  - 0.236234469390588049278459503207E+00;
    xtab[5] =    0.760591978379781302337137826389E-01;
    xtab[6] =    0.380664840144724365880759065541E+00;
    xtab[7] =    0.647766687674009436273648507855E+00;
    xtab[8] =    0.851225220581607910728163628088E+00;
    xtab[9] =   0.971175180702246902734346518378E+00;

    weight[0] =  0.02E+00;
    weight[1] =  0.120296670557481631517310522702E+00;
    weight[2] =  0.204270131879000675555788672223E+00;
    weight[3] =  0.268194837841178696058554475262E+00;
    weight[4] =  0.305859287724422621016275475401E+00;
    weight[5] =  0.313582457226938376695902847302E+00;
    weight[6] =  0.290610164832918311146863077963E+00;
    weight[7] =  0.239193431714379713376571966160E+00;
    weight[8] =  0.164376012736921475701681668908E+00;
    weight[9] = 0.736170054867584989310512940790E-01;
  }
  else if ( order == 11 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.939941935677027005913871284731E+00;
    xtab[2] =  - 0.803421975580293540697597956820E+00;
    xtab[3] =  - 0.601957842073797690275892603234E+00;
    xtab[4] =  - 0.351888923353330214714301017870E+00;
    xtab[5] =  - 0.734775314313212657461903554238E-01;
    xtab[6] =    0.210720306228426314076095789845E+00;
    xtab[7] =    0.477680647983087519467896683890E+00;
    xtab[8] =    0.705777100713859519144801128840E+00;
    xtab[9] =   0.876535856245703748954741265611E+00;
    xtab[10] =   0.976164773135168806180508826082E+00;

    weight[0] =  0.165289256198347107438016528926E-01;
    weight[1] =  0.998460819079680638957534695802E-01;
    weight[2] =  0.171317619206659836486712649042E+00;
    weight[3] =  0.228866123848976624401683231126E+00;
    weight[4] =  0.267867086189684177806638163355E+00;
    weight[5] =  0.285165563941007337460004408915E+00;
    weight[6] =  0.279361333103383045188962195720E+00;
    weight[7] =  0.250925377697128394649140267633E+00;
    weight[8] =  0.202163108540024418349931754266E+00;
    weight[9] = 0.137033682133202256310153880580E+00;
    weight[10] = 0.609250978121311347072183268883E-01;
  }
  else if ( order == 12 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.949452759204959300493337627077E+00;
    xtab[2] =  - 0.833916773105189706586269254036E+00;
    xtab[3] =  - 0.661649799245637148061133087811E+00;
    xtab[4] =  - 0.444406569781935851126642615609E+00;
    xtab[5] =  - 0.196994559534278366455441427346E+00;
    xtab[6] =    0.637247738208319158337792384845E-01;
    xtab[7] =    0.319983684170669623532789532206E+00;
    xtab[8] =    0.554318785912324288984337093085E+00;
    xtab[9] =   0.750761549711113852529400825472E+00;
    xtab[10] =   0.895929097745638894832914608454E+00;
    xtab[11] =   0.979963439076639188313950540264E+00;

    weight[0] =  0.138888888888888888888888888888E-01;
    weight[1] =  0.841721349386809762415796536813E-01;
    weight[2] =  0.145563668853995128522547654706E+00;
    weight[3] =  0.196998534826089634656049637969E+00;
    weight[4] =  0.235003115144985839348633985940E+00;
    weight[5] =  0.256991338152707776127974253598E+00;
    weight[6] =  0.261465660552133103438074715743E+00;
    weight[7] =  0.248121560804009959403073107079E+00;
    weight[8] =  0.217868879026192438848747482023E+00;
    weight[9] = 0.172770639313308564306065766966E+00;
    weight[10] = 0.115907480291738392750341908272E+00;
    weight[11] = 0.512480992072692974680229451351E-01;
  }
  else if ( order == 13 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.956875873668299278183813833834E+00;
    xtab[2] =  - 0.857884202528822035697620310269E+00;
    xtab[3] =  - 0.709105087529871761580423832811E+00;
    xtab[4] =  - 0.519197779050454107485205148087E+00;
    xtab[5] =  - 0.299201300554509985532583446686E+00;
    xtab[6] =  - 0.619016986256353412578604857936E-01;
    xtab[7] =    0.178909837597084635021931298881E+00;
    xtab[8] =    0.409238231474839556754166331248E+00;
    xtab[9] =   0.615697890940291918017885487543E+00;
    xtab[10] =   0.786291018233046684731786459135E+00;
    xtab[11] =   0.911107073689184553949066402429E+00;
    xtab[12] =   0.982921890023145161262671078244E+00;

    weight[0] =  0.118343195266272189349112426036E-01;
    weight[1] =  0.719024162924955289397537405641E-01;
    weight[2] =  0.125103834331152358133769287976E+00;
    weight[3] =  0.171003460470616642463758674512E+00;
    weight[4] =  0.206960611455877074631132560829E+00;
    weight[5] =  0.230888862886995434012203758668E+00;
    weight[6] =  0.241398342287691148630866924129E+00;
    weight[7] =  0.237878547660712031342685189180E+00;
    weight[8] =  0.220534229288451464691077164199E+00;
    weight[9] = 0.190373715559631732254759820746E+00;
    weight[10] = 0.149150950090000205151491864242E+00;
    weight[11] = 0.992678068818470859847363877478E-01;
    weight[12] = 0.437029032679020748288533846051E-01;
  }
  else if ( order == 14 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.962779269978024297120561244319E+00;
    xtab[2] =  - 0.877048918201462024795266773531E+00;
    xtab[3] =  - 0.747389642613378838735429134263E+00;
    xtab[4] =  - 0.580314056546874971105726664999E+00;
    xtab[5] =  - 0.384202003439203313794083903375E+00;
    xtab[6] =  - 0.168887928042680911008441695622E+00;
    xtab[7] =    0.548312279917645496498107146428E-01;
    xtab[8] =    0.275737205435522399182637403545E+00;
    xtab[9] =   0.482752918588474966820418534355E+00;
    xtab[10] =   0.665497977216884537008955042481E+00;
    xtab[11] =   0.814809550601994729434217249123E+00;
    xtab[12] =   0.923203722520643299246334950272E+00;
    xtab[13] =   0.985270697947821356698617003172E+00;

    weight[0] =  0.102040816326530612244897959184E-01;
    weight[1] =  0.621220169077714601661329164668E-01;
    weight[2] =  0.108607722744362826826720935229E+00;
    weight[3] =  0.149620539353121355950520836946E+00;
    weight[4] =  0.183127002125729654123867302103E+00;
    weight[5] =  0.207449763335175672668082886489E+00;
    weight[6] =  0.221369811499570948931671683021E+00;
    weight[7] =  0.224189348002707794238414632220E+00;
    weight[8] =  0.215767100604618851381187446115E+00;
    weight[9] = 0.196525518452982430324613091930E+00;
    weight[10] = 0.167429727891086278990102277038E+00;
    weight[11] = 0.129939668737342347807425737146E+00;
    weight[12] = 0.859405354429804030893077310866E-01;
    weight[13] = 0.377071632698969142774627282919E-01;
  }
  else if ( order == 15 )
  {
    xtab[0] =  - 1.0E+00;
    xtab[1] =  - 0.967550468197200476562456018282E+00;
    xtab[2] =  - 0.892605400120550767066811886849E+00;
    xtab[3] =  - 0.778685617639031079381743321893E+00;
    xtab[4] =  - 0.630779478886949283946148437224E+00;
    xtab[5] =  - 0.455352905778529370872053455981E+00;
    xtab[6] =  - 0.260073376740807915768961188263E+00;
    xtab[7] =  - 0.534757226797460641074538896258E-01;
    xtab[8] =    0.155410685384859484319182024964E+00;
    xtab[9] =   0.357456512022127651195319205174E+00;
    xtab[10] =   0.543831458701484016930711802760E+00;
    xtab[11] =   0.706390264637572540152679669478E+00;
    xtab[12] =   0.838029000636089631215097384520E+00;
    xtab[13] =   0.932997190935973719928072142859E+00;
    xtab[14] =   0.987166478414363086378359071811E+00;

    weight[0] =  0.888888888888888888888888888889E-02;
    weight[1] =  0.542027800486444943382142368018E-01;
    weight[2] =  0.951295994604808992038477266346E-01;
    weight[3] =  0.131875462504951632186262157944E+00;
    weight[4] =  0.162854477303832629448732245828E+00;
    weight[5] =  0.186715145839450908083795103799E+00;
    weight[6] =  0.202415187030618429872703310435E+00;
    weight[7] =  0.209268608147694581430889790306E+00;
    weight[8] =  0.206975960249553755479027321787E+00;
    weight[9] = 0.195637503045116116473556617575E+00;
    weight[10] = 0.175748872642447685670310440476E+00;
    weight[11] = 0.148179527003467253924682058743E+00;
    weight[12] = 0.114135203489752753013075582569E+00;
    weight[13] = 0.751083927605064397329716653914E-01;
    weight[14] = 0.328643915845935322530428528231E-01;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "RADAU_SET - Fatal error!\n";
    std::cerr << "  Illegal value of ORDER = " << order << "\n";
    std::cerr << "  Legal values are 1 to 15.\n";
    exit ( 1 );
  }

  return;
}